

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurseSolution.cpp
# Opt level: O0

bool __thiscall NurseSolution::removeTurn(NurseSolution *this,Turn *turn)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  __normal_iterator<Turn_**,_std::vector<Turn_*,_std::allocator<Turn_*>_>_> local_30;
  const_iterator local_28;
  Turn *local_20;
  Turn *turn_local;
  NurseSolution *this_local;
  
  local_20 = turn;
  turn_local = (Turn *)this;
  bVar1 = hasTurn(this,turn);
  if (bVar1) {
    __first = std::begin<std::vector<Turn*,std::allocator<Turn*>>>(&this->turns);
    __last = std::end<std::vector<Turn*,std::allocator<Turn*>>>(&this->turns);
    local_30 = std::
               find<__gnu_cxx::__normal_iterator<Turn**,std::vector<Turn*,std::allocator<Turn*>>>,Turn*>
                         (__first._M_current,__last._M_current,&local_20);
    __gnu_cxx::__normal_iterator<Turn*const*,std::vector<Turn*,std::allocator<Turn*>>>::
    __normal_iterator<Turn**>
              ((__normal_iterator<Turn*const*,std::vector<Turn*,std::allocator<Turn*>>> *)&local_28,
               &local_30);
    std::vector<Turn_*,_std::allocator<Turn_*>_>::erase(&this->turns,local_28);
  }
  return bVar1;
}

Assistant:

const bool NurseSolution::removeTurn( Turn *turn) {
    if (!hasTurn(turn))
        return false;

    turns.erase(find(begin(turns), end(turns), turn));

    return true;
}